

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::CPC::~CPC(CPC *this)

{
  BoxArray *in_RDI;
  
  BoxArray::~BoxArray(in_RDI);
  BoxArray::~BoxArray(in_RDI);
  CommMetaData::~CommMetaData((CommMetaData *)in_RDI);
  return;
}

Assistant:

FabArrayBase::CPC::~CPC ()
{}